

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtCore.cpp
# Opt level: O3

JsErrorCode JsGetArrayBufferFreeFunction(JsValueRef arrayBuffer,ArrayBufferFreeFn *freeFn)

{
  bool bVar1;
  JsErrorCode JVar2;
  int iVar3;
  JsrtContext *currentContext;
  ArrayBuffer *pAVar4;
  undefined4 extraout_var;
  AutoNestedHandledExceptionType local_48 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  
  if (arrayBuffer == (JsValueRef)0x0) {
    JVar2 = JsErrorInvalidArgument;
  }
  else if (freeFn == (ArrayBufferFreeFn *)0x0) {
    JVar2 = JsErrorNullArgument;
  }
  else {
    currentContext = JsrtContext::GetCurrent();
    JVar2 = CheckContext(currentContext,false,false);
    if (JVar2 == JsNoError) {
      AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                (local_48,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
      bVar1 = Js::VarIs<Js::ArrayBuffer>(arrayBuffer);
      JVar2 = JsErrorInvalidArgument;
      if (bVar1) {
        pAVar4 = Js::VarTo<Js::ArrayBuffer>(arrayBuffer);
        iVar3 = (*(pAVar4->super_ArrayBufferBase).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x74])(pAVar4);
        *freeFn = (ArrayBufferFreeFn)CONCAT44(extraout_var,iVar3);
        JVar2 = JsNoError;
      }
      AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_48);
    }
  }
  return JVar2;
}

Assistant:

CHAKRA_API
JsGetArrayBufferFreeFunction(
    _In_ JsValueRef arrayBuffer,
    _Out_ ArrayBufferFreeFn* freeFn)
{
  VALIDATE_JSREF(arrayBuffer);
  PARAM_NOT_NULL(freeFn);
  return ContextAPINoScriptWrapper_NoRecord(
      [&](Js::ScriptContext* scriptContext) -> JsErrorCode {
        if (!Js::VarIs<Js::ArrayBuffer>(arrayBuffer))
        {
          return JsErrorInvalidArgument;
        }

        *freeFn = Js::VarTo<Js::ArrayBuffer>(arrayBuffer)->GetArrayBufferFreeFn();
        return JsNoError;
      });
}